

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::ConvertToSampledImagePass::UpdateSampledImageUses
          (ConvertToSampledImagePass *this,Instruction *image_load,Instruction *image_extraction,
          DescriptorSetAndBinding *image_descriptor_set_binding)

{
  IRContext *pIVar1;
  DefUseManager *this_00;
  Instruction *sampled_image_inst;
  pointer pOVar2;
  pointer ppIVar3;
  bool bVar4;
  uint32_t before;
  uint32_t after;
  array<signed_char,_4UL> aVar5;
  ulong uVar6;
  ulong uVar7;
  pointer ppIVar8;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  sampled_image_users;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FindUses(this,image_load,&local_48,OpSampledImage);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  ppIVar3 = local_48.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (pIVar1->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    ppIVar8 = local_48.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      sampled_image_inst = *ppIVar8;
      bVar4 = IsSamplerOfSampledImageDecoratedByDescriptorSetBinding
                        (this,sampled_image_inst,image_descriptor_set_binding);
      if (bVar4) {
        pIVar1 = (this->super_Pass).context_;
        after = 0;
        before = 0;
        if (sampled_image_inst->has_result_id_ == true) {
          before = Instruction::GetSingleWordOperand
                             (sampled_image_inst,(uint)sampled_image_inst->has_type_id_);
        }
        if (image_load->has_result_id_ == true) {
          after = Instruction::GetSingleWordOperand(image_load,(uint)image_load->has_type_id_);
        }
        IRContext::ReplaceAllUsesWith(pIVar1,before,after);
        analysis::DefUseManager::AnalyzeInstUse(this_00,image_load);
        IRContext::KillInst((this->super_Pass).context_,sampled_image_inst);
      }
      else {
        if (image_extraction == (Instruction *)0x0) {
          image_extraction = CreateImageExtraction(this,image_load);
        }
        aVar5._M_elems[0] = '\0';
        aVar5._M_elems[1] = '\0';
        aVar5._M_elems[2] = '\0';
        aVar5._M_elems[3] = '\0';
        if (image_extraction->has_result_id_ == true) {
          aVar5._M_elems =
               (_Type)Instruction::GetSingleWordOperand
                                (image_extraction,(uint)image_extraction->has_type_id_);
        }
        local_70._0_8_ = &PTR__SmallVector_003d7c78;
        local_70._24_8_ = local_70 + 0x10;
        local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_70._8_8_ = 1;
        uVar6 = (ulong)(sampled_image_inst->has_result_id_ & 1) + 1;
        if (sampled_image_inst->has_type_id_ == false) {
          uVar6 = (ulong)sampled_image_inst->has_result_id_;
        }
        pOVar2 = (sampled_image_inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = ((long)(sampled_image_inst->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
                -0x5555555555555555;
        local_70._16_4_ = aVar5._M_elems;
        if (uVar7 < uVar6 || uVar7 - uVar6 == 0) {
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2b8,
                        "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                       );
        }
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)
                   ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
                   (ulong)(uint)((int)uVar6 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_70);
        local_70._0_8_ = &PTR__SmallVector_003d7c78;
        if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_50,local_50._M_head_impl);
        }
        analysis::DefUseManager::AnalyzeInstUse(this_00,sampled_image_inst);
      }
      ppIVar8 = ppIVar8 + 1;
    } while (ppIVar8 != ppIVar3);
  }
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ConvertToSampledImagePass::UpdateSampledImageUses(
    Instruction* image_load, Instruction* image_extraction,
    const DescriptorSetAndBinding& image_descriptor_set_binding) {
  std::vector<Instruction*> sampled_image_users;
  FindUses(image_load, &sampled_image_users, spv::Op::OpSampledImage);

  auto* def_use_mgr = context()->get_def_use_mgr();
  for (auto* sampled_image_inst : sampled_image_users) {
    if (IsSamplerOfSampledImageDecoratedByDescriptorSetBinding(
            sampled_image_inst, image_descriptor_set_binding)) {
      context()->ReplaceAllUsesWith(sampled_image_inst->result_id(),
                                    image_load->result_id());
      def_use_mgr->AnalyzeInstUse(image_load);
      context()->KillInst(sampled_image_inst);
    } else {
      if (!image_extraction)
        image_extraction = CreateImageExtraction(image_load);
      sampled_image_inst->SetInOperand(0, {image_extraction->result_id()});
      def_use_mgr->AnalyzeInstUse(sampled_image_inst);
    }
  }
}